

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplex_tree_ctor_and_move_unit_test.cpp
# Opt level: O0

void print_simplex_filtration<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>>
               (Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default> *st,string *msg)

{
  bool bVar1;
  type_conflict4 tVar2;
  reference rVar3;
  int iVar4;
  ostream *poVar5;
  size_t sVar6;
  Filtration_simplex_range *this;
  reference other;
  vector<int,_std::allocator<int>_> *__x;
  Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>
  SVar7;
  short vertex;
  Siblings *local_f0;
  Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>
  __end0_1;
  Siblings *local_d0;
  Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>
  __begin0_1;
  iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>,_boost::iterators::incrementable_traversal_tag>
  local_b8;
  iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>,_boost::iterators::incrementable_traversal_tag>
  *local_98;
  Simplex_vertex_range *__range2;
  vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>_>_*,_true>
  local_80;
  vector<int,_std::allocator<int>_> local_78;
  string local_60;
  vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>_>_*,_true>
  local_40;
  vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>_>_*,_true>
  f_simplex;
  const_iterator __end0;
  const_iterator __begin0;
  Filtration_simplex_range *__range1;
  string *msg_local;
  Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default> *st_local;
  
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>::initialize_filtration
            (st,false);
  std::operator<<((ostream *)&std::clog,
                  "********************************************************************\n");
  poVar5 = std::operator<<((ostream *)&std::clog,"* ");
  poVar5 = std::operator<<(poVar5,(string *)msg);
  std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<((ostream *)&std::clog,"* The complex contains ");
  sVar6 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>::num_simplices
                    (st);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,sVar6);
  std::operator<<(poVar5," simplices");
  poVar5 = std::operator<<((ostream *)&std::clog,"   - dimension ");
  iVar4 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>::dimension(st);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar4);
  std::operator<<(poVar5,"\n");
  std::operator<<((ostream *)&std::clog,
                  "* Iterator on Simplices in the filtration, with [filtration value]:\n");
  this = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>::
         filtration_simplex_range(st);
  __end0 = std::
           vector<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>_>_*,_true>_>_>
           ::begin(this);
  f_simplex.m_ptr =
       (pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>_>
        *)std::
          vector<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>_>_*,_true>_>_>
          ::end(this);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<const_boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>_>_*,_true>_*,_std::vector<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>_>_*,_true>_>_>_>
                                *)&f_simplex);
    if (!bVar1) break;
    other = __gnu_cxx::
            __normal_iterator<const_boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>_>_*,_true>_*,_std::vector<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>_>_*,_true>_>_>_>
            ::operator*(&__end0);
    boost::container::
    vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>_>_*,_true>
    ::vec_iterator(&local_40,other);
    poVar5 = std::operator<<((ostream *)&std::clog,"   ");
    poVar5 = std::operator<<(poVar5,"[");
    boost::container::
    vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>_>_*,_true>
    ::vec_iterator(&local_80,&local_40);
    __x = &Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>::filtration
                     (&local_80)->super_vector<int,_std::allocator<int>_>;
    std::vector<int,_std::allocator<int>_>::vector(&local_78,__x);
    print_filtration_value_abi_cxx11_(&local_60,&local_78);
    poVar5 = std::operator<<(poVar5,(string *)&local_60);
    std::operator<<(poVar5,"] ");
    std::__cxx11::string::~string((string *)&local_60);
    std::vector<int,_std::allocator<int>_>::~vector(&local_78);
    boost::container::
    vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>_>_*,_true>
    ::vec_iterator((vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>_>_*,_true>
                    *)&__begin0_1.v_,&local_40);
    Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>::simplex_vertex_range
              ((Simplex_vertex_range *)&local_b8,st,(Simplex_handle *)&__begin0_1.v_);
    local_98 = &local_b8;
    SVar7 = boost::iterator_range_detail::
            iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>,_boost::iterators::incrementable_traversal_tag>
            ::begin(&local_b8);
    __end0_1._8_8_ = SVar7.sib_;
    __begin0_1.sib_._0_2_ = SVar7.v_;
    local_d0 = (Siblings *)__end0_1._8_8_;
    SVar7 = boost::iterator_range_detail::
            iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>,_boost::iterators::incrementable_traversal_tag>
            ::end(local_98);
    local_f0 = SVar7.sib_;
    __end0_1.sib_._0_2_ = SVar7.v_;
    while( true ) {
      tVar2 = boost::iterators::operator!=
                        ((iterator_facade<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>,_const_short,_boost::iterators::forward_traversal_tag,_const_short,_long>
                          *)&local_d0,
                         (iterator_facade<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>,_const_short,_boost::iterators::forward_traversal_tag,_const_short,_long>
                          *)&local_f0);
      if (!tVar2) break;
      rVar3 = boost::iterators::detail::
              iterator_facade_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>,_const_short,_boost::iterators::forward_traversal_tag,_const_short,_long,_false,_false>
              ::operator*((iterator_facade_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>,_const_short,_boost::iterators::forward_traversal_tag,_const_short,_long,_false,_false>
                           *)&local_d0);
      poVar5 = std::operator<<((ostream *)&std::clog,"(");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,rVar3);
      std::operator<<(poVar5,")");
      boost::iterators::detail::
      iterator_facade_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>,_const_short,_boost::iterators::forward_traversal_tag,_const_short,_long,_false,_false>
      ::operator++((iterator_facade_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>,_const_short,_boost::iterators::forward_traversal_tag,_const_short,_long,_false,_false>
                    *)&local_d0);
    }
    std::ostream::operator<<(&std::clog,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::
    __normal_iterator<const_boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>_>_*,_true>_*,_std::vector<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>_>_*,_true>_>_>_>
    ::operator++(&__end0);
  }
  return;
}

Assistant:

void print_simplex_filtration(const Simplex_tree& st, const std::string& msg) {
  // Required before browsing through filtration values
  st.initialize_filtration();

  std::clog << "********************************************************************\n";
  std::clog << "* " << msg << "\n";
  std::clog << "* The complex contains " << st.num_simplices() << " simplices";
  std::clog << "   - dimension " << st.dimension() << "\n";
  std::clog << "* Iterator on Simplices in the filtration, with [filtration value]:\n";
  for (auto f_simplex : st.filtration_simplex_range()) {
    std::clog << "   "
              << "[" << print_filtration_value(st.filtration(f_simplex)) << "] ";
    for (auto vertex : st.simplex_vertex_range(f_simplex)) std::clog << "(" << vertex << ")";
    std::clog << std::endl;
  }

}